

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_highbd_hadamard_8x8_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  short *psVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  short sVar14;
  int iVar15;
  short sVar16;
  int iVar17;
  short sVar18;
  int iVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  int iVar23;
  int32_t buffer2 [64];
  short asStack_1b8 [16];
  short asStack_198 [8];
  short asStack_188 [8];
  short asStack_178 [8];
  short asStack_168 [8];
  short asStack_158 [8];
  short local_148 [8];
  tran_low_t local_138;
  int local_134 [65];
  
  for (lVar8 = 0; (int)lVar8 != 0x10; lVar8 = lVar8 + 2) {
    psVar6 = (short *)((long)src_diff + lVar8);
    sVar18 = psVar6[src_stride] + *psVar6;
    sVar16 = *psVar6 - psVar6[src_stride];
    sVar22 = psVar6[src_stride * 3] + psVar6[src_stride * 2];
    sVar21 = psVar6[src_stride * 2] - psVar6[src_stride * 3];
    sVar10 = psVar6[src_stride * 5] + psVar6[src_stride * 4];
    sVar20 = psVar6[src_stride * 4] - psVar6[src_stride * 5];
    sVar14 = psVar6[src_stride * 7] + psVar6[src_stride * 6];
    sVar11 = psVar6[src_stride * 6] - psVar6[src_stride * 7];
    sVar1 = sVar18 + sVar22;
    sVar2 = sVar21 + sVar16;
    sVar18 = sVar18 - sVar22;
    sVar16 = sVar16 - sVar21;
    sVar21 = sVar14 + sVar10;
    sVar22 = sVar20 + sVar11;
    sVar10 = sVar10 - sVar14;
    sVar20 = sVar20 - sVar11;
    asStack_1b8[lVar8 * 4] = sVar21 + sVar1;
    asStack_1b8[lVar8 * 4 + 7] = sVar2 + sVar22;
    asStack_1b8[lVar8 * 4 + 3] = sVar10 + sVar18;
    asStack_1b8[lVar8 * 4 + 4] = sVar20 + sVar16;
    asStack_1b8[lVar8 * 4 + 2] = sVar1 - sVar21;
    asStack_1b8[lVar8 * 4 + 6] = sVar2 - sVar22;
    asStack_1b8[lVar8 * 4 + 1] = sVar18 - sVar10;
    asStack_1b8[lVar8 * 4 + 5] = sVar16 - sVar20;
  }
  piVar7 = local_134 + 6;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    iVar13 = (int)asStack_1b8[lVar8 + 8] + (int)asStack_1b8[lVar8];
    iVar12 = (int)asStack_1b8[lVar8] - (int)asStack_1b8[lVar8 + 8];
    iVar3 = (int)asStack_188[lVar8] + (int)asStack_198[lVar8];
    iVar9 = (int)asStack_198[lVar8] - (int)asStack_188[lVar8];
    iVar17 = (int)asStack_168[lVar8] + (int)asStack_178[lVar8];
    iVar15 = (int)asStack_178[lVar8] - (int)asStack_168[lVar8];
    iVar4 = (int)local_148[lVar8] + (int)asStack_158[lVar8];
    iVar23 = (int)asStack_158[lVar8] - (int)local_148[lVar8];
    iVar19 = iVar3 + iVar13;
    iVar5 = iVar9 + iVar12;
    iVar13 = iVar13 - iVar3;
    iVar12 = iVar12 - iVar9;
    iVar9 = iVar4 + iVar17;
    iVar3 = iVar23 + iVar15;
    iVar17 = iVar17 - iVar4;
    iVar15 = iVar15 - iVar23;
    piVar7[-7] = iVar9 + iVar19;
    *piVar7 = iVar3 + iVar5;
    piVar7[-4] = iVar17 + iVar13;
    piVar7[-3] = iVar15 + iVar12;
    piVar7[-5] = iVar19 - iVar9;
    piVar7[-1] = iVar5 - iVar3;
    piVar7[-6] = iVar13 - iVar17;
    piVar7[-2] = iVar12 - iVar15;
    piVar7 = piVar7 + 8;
  }
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
    coeff[lVar8] = (&local_138)[lVar8];
  }
  return;
}

Assistant:

void aom_highbd_hadamard_8x8_c(const int16_t *src_diff, ptrdiff_t src_stride,
                               tran_low_t *coeff) {
  int idx;
  int16_t buffer[64];
  int32_t buffer2[64];
  int16_t *tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    // src_diff: 13 bit
    // buffer: 16 bit, dynamic range [-32760, 32760]
    hadamard_highbd_col8_first_pass(src_diff, src_stride, tmp_buf);
    tmp_buf += 8;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (idx = 0; idx < 8; ++idx) {
    // buffer: 16 bit
    // buffer2: 19 bit, dynamic range [-262080, 262080]
    hadamard_highbd_col8_second_pass(tmp_buf, 8, buffer2 + 8 * idx);
    ++tmp_buf;
  }

  for (idx = 0; idx < 64; ++idx) coeff[idx] = (tran_low_t)buffer2[idx];
}